

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *this)

{
  char cVar1;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_RDI;
  char c;
  int in_stack_00000064;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  *in_stack_00000068;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 value;
  VarBoundHandler<testing::NiceMock<MockNLHandler>_> *this_00;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  CStringRef arg0;
  BasicTestExpr<0> local_4;
  
  value = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  arg0.data_ = (char *)in_RDI;
  cVar1 = ReaderBase::ReadChar(&in_RDI->reader_->super_ReaderBase);
  switch(cVar1) {
  case 'l':
  case 'n':
  case 's':
    this_00 = in_RDI->handler_;
    ReadConstant((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *)in_stack_ffffffffffffffe0.data_,'\0');
    local_4.id_ = (IDType)NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>::OnBool
                                    ((NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>
                                      *)this_00,(bool)value);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"expected logical expression");
    TextReader<fmt::Locale>::ReportError<>
              ((TextReader<fmt::Locale> *)CONCAT17(cVar1,in_stack_ffffffffffffffe8),arg0);
    BasicTestExpr<0>::BasicTestExpr(&local_4,NULL_ID);
    break;
  case 'o':
    ReadOpCode(in_RDI);
    local_4.id_ = (IDType)ReadLogicalExpr(in_stack_00000068,in_stack_00000064);
  }
  return (LogicalExpr)local_4.id_;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}